

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  size_type sVar1;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar2;
  CallReaction CVar3;
  void *local_18;
  void *local_10;
  
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  this = &anon_unknown_6::UninterestingCallReactionMap()->_M_h;
  local_10 = mock_obj;
  sVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(this,(key_type *)&local_10);
  if (sVar1 == 0) {
    CVar3 = kWarn;
    if (FLAGS_gmock_default_mock_behavior < (kFail|kWarn)) {
      CVar3 = FLAGS_gmock_default_mock_behavior;
    }
  }
  else {
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)anon_unknown_6::UninterestingCallReactionMap();
    local_18 = mock_obj;
    pmVar2 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,(key_type *)&local_18);
    CVar3 = *pmVar2;
  }
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return CVar3;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (UninterestingCallReactionMap().count(
              reinterpret_cast<uintptr_t>(mock_obj)) == 0)
             ? internal::intToCallReaction(
                   GMOCK_FLAG_GET(default_mock_behavior))
             : UninterestingCallReactionMap()[reinterpret_cast<uintptr_t>(
                   mock_obj)];
}